

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O2

void __thiscall CHeap::Clear(CHeap *this)

{
  CChunk *pCVar1;
  CChunk *p;
  
  p = this->m_pCurrent;
  while (p != (CChunk *)0x0) {
    pCVar1 = p->m_pNext;
    mem_free(p);
    p = pCVar1;
  }
  this->m_pCurrent = (CChunk *)0x0;
  return;
}

Assistant:

void CHeap::Clear()
{
	CChunk *pChunk = m_pCurrent;

	while(pChunk)
	{
		CChunk *pNext = pChunk->m_pNext;
		mem_free(pChunk);
		pChunk = pNext;
	}

	m_pCurrent = 0x0;
}